

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

int os_file_stat(char *fname,int follow_links,os_file_stat_t *s)

{
  long lVar1;
  int iVar2;
  __uid_t _Var3;
  int iVar4;
  __gid_t _Var5;
  char *pcVar6;
  ulong uVar7;
  __array groups;
  stat buf;
  
  if (follow_links == 0) {
    iVar2 = lstat(fname,(stat *)&buf);
  }
  else {
    iVar2 = stat(fname,(stat *)&buf);
  }
  iVar4 = 0;
  if (iVar2 == 0) {
    s->sizelo = (undefined4)buf.st_size;
    s->sizehi = buf.st_size._4_4_;
    s->cre_time = buf.st_ctim.tv_sec;
    s->mod_time = buf.st_mtim.tv_sec;
    s->acc_time = buf.st_atim.tv_sec;
    s->mode = (ulong)buf.st_mode;
    s->attrs = 0;
    pcVar6 = os_get_root_name(fname);
    if (*pcVar6 == '.') {
      *(byte *)&s->attrs = (byte)s->attrs | 1;
    }
    _Var3 = geteuid();
    if (_Var3 == buf.st_uid) {
      if ((buf.st_mode >> 8 & 1) != 0) {
        *(byte *)&s->attrs = (byte)s->attrs | 4;
      }
      iVar4 = 1;
      if ((char)buf.st_mode < '\0') {
        *(byte *)&s->attrs = (byte)s->attrs | 8;
      }
    }
    else {
      iVar4 = 0;
      iVar2 = getgroups(0,(__gid_t *)0x0);
      if (0xfffefffe < iVar2 - 0x10000U) {
        std::make_unique<unsigned_int[]>((size_t)&groups);
        iVar4 = getgroups(iVar2,(__gid_t *)
                                ((long)groups._M_t.
                                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                       .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                                4));
        if (iVar4 < 0) {
          iVar4 = 0;
        }
        else {
          _Var5 = getegid();
          *(__gid_t *)
           groups._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
           _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = _Var5;
          uVar7 = 0;
          do {
            iVar4 = 1;
            if (iVar2 + 1 == uVar7) {
              if ((buf.st_mode & 4) != 0) {
                *(byte *)&s->attrs = (byte)s->attrs | 4;
              }
              if ((buf.st_mode & 2) == 0) goto LAB_001d2e64;
              goto LAB_001d2e60;
            }
            lVar1 = uVar7 * 4;
            uVar7 = uVar7 + 1;
          } while (buf.st_gid !=
                   *(__gid_t *)
                    ((long)groups._M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + lVar1));
          if ((buf.st_mode & 0x20) != 0) {
            *(byte *)&s->attrs = (byte)s->attrs | 4;
          }
          if ((buf.st_mode & 0x10) != 0) {
LAB_001d2e60:
            *(byte *)&s->attrs = (byte)s->attrs | 8;
          }
        }
LAB_001d2e64:
        std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr(&groups);
      }
    }
  }
  return iVar4;
}

Assistant:

int
os_file_stat( const char *fname, int follow_links, os_file_stat_t *s )
{
    struct stat buf;
    if ((follow_links ? stat(fname, &buf) : lstat(fname, &buf)) != 0)
        return false;

    s->sizelo = (uint32_t)(buf.st_size & 0xFFFFFFFF);
    s->sizehi = sizeof(buf.st_size) > 4
                ? (uint32_t)((buf.st_size >> 32) & 0xFFFFFFFF)
                : 0;
    s->cre_time = buf.st_ctime;
    s->mod_time = buf.st_mtime;
    s->acc_time = buf.st_atime;
    s->mode = buf.st_mode;
    s->attrs = 0;

    if (os_get_root_name(fname)[0] == '.') {
        s->attrs |= OSFATTR_HIDDEN;
    }

    // If we're the owner, check if we have read/write access.
    if (geteuid() == buf.st_uid) {
        if (buf.st_mode & S_IRUSR)
            s->attrs |= OSFATTR_READ;
        if (buf.st_mode & S_IWUSR)
            s->attrs |= OSFATTR_WRITE;
        return true;
    }

    // Check if one of our groups matches the file's group and if so, check
    // for read/write access.

    // Also reserve a spot for the effective group ID, which might
    // not be included in the list in our next call.
    int grpSize = getgroups(0, NULL) + 1;
    // Paranoia.
    if (grpSize > NGROUPS_MAX or grpSize < 0)
        return false;

    const auto groups = std::make_unique<gid_t[]>(grpSize);
    if (getgroups(grpSize - 1, groups.get() + 1) < 0) {
        return false;
    }
    groups[0] = getegid();
    int i;
    for (i = 0; i < grpSize and buf.st_gid != groups[i]; ++i)
        ;
    if (i < grpSize) {
        if (buf.st_mode & S_IRGRP)
            s->attrs |= OSFATTR_READ;
        if (buf.st_mode & S_IWGRP)
            s->attrs |= OSFATTR_WRITE;
        return true;
    }

    // We're neither the owner of the file nor do we belong to its
    // group.  Check whether the file is world readable/writable.
    if (buf.st_mode & S_IROTH)
        s->attrs |= OSFATTR_READ;
    if (buf.st_mode & S_IWOTH)
        s->attrs |= OSFATTR_WRITE;
    return true;
}